

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

double __thiscall fasttext::Args::getAutotuneMetricValue(Args *this)

{
  long in_RDI;
  size_t *__idx;
  float fVar1;
  string valueStr;
  size_t secondSemicolon;
  size_t firstSemicolon;
  double value;
  Args *in_stack_00000068;
  metric_name metric;
  string *__str;
  string local_48;
  undefined8 local_28;
  undefined8 local_20;
  double local_18;
  metric_name local_c;
  
  local_c = getAutotuneMetric(in_stack_00000068);
  local_18 = 0.0;
  if ((((local_c == precisionAtRecallLabel) || (local_c == precisionAtRecall)) ||
      (local_c == recallAtPrecisionLabel)) || (local_c == recallAtPrecision)) {
    local_20 = 0x12;
    __idx = (size_t *)(in_RDI + 0x148);
    local_28 = std::__cxx11::string::find((char)__idx,0x3a);
    __str = &local_48;
    std::__cxx11::string::substr((ulong)__str,(ulong)__idx);
    fVar1 = std::__cxx11::stof(__str,__idx);
    local_18 = (double)fVar1 / 100.0;
    std::__cxx11::string::~string((string *)&local_48);
  }
  return local_18;
}

Assistant:

double Args::getAutotuneMetricValue() const {
  metric_name metric = getAutotuneMetric();
  double value = 0.0;
  if (metric == metric_name::precisionAtRecallLabel ||
      metric == metric_name::precisionAtRecall ||
      metric == metric_name::recallAtPrecisionLabel ||
      metric == metric_name::recallAtPrecision) {
    size_t firstSemicolon = 18; // semicolon position in "precisionAtRecall:"
    size_t secondSemicolon = autotuneMetric.find(':', firstSemicolon);
    const std::string valueStr =
        autotuneMetric.substr(firstSemicolon, secondSemicolon - firstSemicolon);
    value = std::stof(valueStr) / 100.0;
  }
  return value;
}